

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::RemoveTxOut(AbstractTransaction *this,uint32_t index)

{
  undefined8 uVar1;
  CfdError in_stack_ffffffffffffff9c;
  CfdException *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  int local_18;
  uint local_14;
  int ret;
  uint32_t index_local;
  AbstractTransaction *this_local;
  
  local_14 = index;
  _ret = this;
  (*this->_vptr_AbstractTransaction[0xc])(this,(ulong)index,0x228,"RemoveTxOut");
  local_18 = wally_tx_remove_output((wally_tx *)((string *)this)->_M_string_length,(ulong)local_14);
  if (local_18 != 0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x22d;
    local_30.funcname = "RemoveTxOut";
    logger::warn<int&>(&local_30,"wally_tx_remove_output NG[{}].",&local_18);
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_50,"vout remove error.",&local_51);
    CfdException::CfdException(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(string *)this);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void AbstractTransaction::RemoveTxOut(uint32_t index) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  int ret = wally_tx_remove_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), index);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_remove_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout remove error.");
  }
}